

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_end_of_breakfast(tgestate_t *state)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x6e8) = 0x28;
  end_of_breakfast(state);
  return;
}

Assistant:

static void event_end_of_breakfast(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  end_of_breakfast(state);
}